

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O0

int SMPI_Allgather(void *sendbuf,int sendcount,SMPI_Datatype sendtype,void *recvbuf,int recvcount,
                  SMPI_Datatype recvtype,SMPI_Comm comm)

{
  undefined4 in_EDX;
  int ret;
  SMPI_Comm in_stack_00000170;
  SMPI_Datatype in_stack_00000178;
  int in_stack_0000017c;
  void *in_stack_00000180;
  int in_stack_0000018c;
  unsigned_long *in_stack_00000190;
  int local_24;
  
  local_24 = 0;
  switch(in_EDX) {
  case 0:
    local_24 = anon_unknown.dwarf_df27d1::SMPI_Allgather_Impl<int>
                         ((int *)in_stack_00000190,in_stack_0000018c,in_stack_00000180,
                          in_stack_0000017c,in_stack_00000178,in_stack_00000170);
    break;
  case 1:
    local_24 = anon_unknown.dwarf_df27d1::SMPI_Allgather_Impl<long>
                         ((long *)in_stack_00000190,in_stack_0000018c,in_stack_00000180,
                          in_stack_0000017c,in_stack_00000178,in_stack_00000170);
    break;
  case 2:
    local_24 = anon_unknown.dwarf_df27d1::SMPI_Allgather_Impl<unsigned_long>
                         (in_stack_00000190,in_stack_0000018c,in_stack_00000180,in_stack_0000017c,
                          in_stack_00000178,in_stack_00000170);
    break;
  case 3:
    local_24 = anon_unknown.dwarf_df27d1::SMPI_Allgather_Impl<char>
                         ((char *)in_stack_00000190,in_stack_0000018c,in_stack_00000180,
                          in_stack_0000017c,in_stack_00000178,in_stack_00000170);
    break;
  case 4:
    local_24 = anon_unknown.dwarf_df27d1::SMPI_Allgather_Impl<unsigned_char>
                         ((uchar *)in_stack_00000190,in_stack_0000018c,in_stack_00000180,
                          in_stack_0000017c,in_stack_00000178,in_stack_00000170);
  }
  return local_24;
}

Assistant:

int SMPI_Allgather(const void *sendbuf, int sendcount, SMPI_Datatype sendtype, void *recvbuf,
                   int recvcount, SMPI_Datatype recvtype, SMPI_Comm comm)
{
    int ret = 0;
    switch (sendtype)
    {
#define F(type)                                                                                    \
    ret = SMPI_Allgather_Impl(static_cast<const type *>(sendbuf), sendcount, recvbuf, recvcount,   \
                              recvtype, comm)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return ret;
}